

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::_clear_range(Tree *this,size_t first,size_t num)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  ulong uVar4;
  long lVar5;
  long in_RDX;
  ulong in_RSI;
  long *in_RDI;
  NodeData *n;
  size_t e;
  size_t i;
  char msg [51];
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff48;
  Location *this_00;
  ulong local_88;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  Location local_58;
  long local_18;
  ulong local_10;
  
  if (in_RDX != 0) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    if ((ulong)in_RDI[1] < in_RSI + in_RDX) {
      memcpy(&local_58,"check failed: (first >= 0 && first + num <= m_cap)",0x33);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      pcVar1 = (code *)in_RDI[0xb];
      this_00 = &local_58;
      Location::Location(this_00,in_stack_ffffffffffffff48,
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                         CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      (*pcVar1)(this_00,0x33,in_RDI[8]);
      in_stack_ffffffffffffff38 = local_70;
      in_stack_ffffffffffffff3c = uStack_6c;
      in_stack_ffffffffffffff40 = uStack_68;
      in_stack_ffffffffffffff44 = uStack_64;
    }
    memset((void *)(*in_RDI + local_10 * 0x90),0,local_18 * 0x90);
    uVar4 = local_10 + local_18;
    for (local_88 = local_10; local_88 < uVar4; local_88 = local_88 + 1) {
      _clear((Tree *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      lVar5 = *in_RDI + local_88 * 0x90;
      *(ulong *)(lVar5 + 0x88) = local_88 - 1;
      *(ulong *)(lVar5 + 0x80) = local_88 + 1;
    }
    *(undefined8 *)(*in_RDI + (local_10 + local_18 + -1) * 0x90 + 0x80) = 0xffffffffffffffff;
  }
  return;
}

Assistant:

void Tree::_clear_range(size_t first, size_t num)
{
    if(num == 0)
        return; // prevent overflow when subtracting
    _RYML_CB_ASSERT(m_callbacks, first >= 0 && first + num <= m_cap);
    memset(m_buf + first, 0, num * sizeof(NodeData)); // TODO we should not need this
    for(size_t i = first, e = first + num; i < e; ++i)
    {
        _clear(i);
        NodeData *n = m_buf + i;
        n->m_prev_sibling = i - 1;
        n->m_next_sibling = i + 1;
    }
    m_buf[first + num - 1].m_next_sibling = NONE;
}